

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1529.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  undefined1 local_228 [8];
  char bURL [512];
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  bURL[0x1fc] = '\x02';
  bURL[0x1fd] = '\0';
  bURL[0x1fe] = '\0';
  bURL[0x1ff] = '\0';
  curl_msnprintf(local_228,0x200,"%s HTTP/1.1\r\nGET http://1529.com/1529",URL);
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      bURL._508_4_ = curl_easy_setopt(lVar2,0x2712,local_228);
      if ((((bURL._508_4_ == 0) &&
           (bURL._508_4_ = curl_easy_setopt(lVar2,0x2714,libtest_arg2), bURL._508_4_ == 0)) &&
          (bURL._508_4_ = curl_easy_setopt(lVar2,0x29,1), bURL._508_4_ == 0)) &&
         ((bURL._508_4_ = curl_easy_setopt(lVar2,0x65,0), bURL._508_4_ == 0 &&
          (bURL._508_4_ = curl_easy_setopt(lVar2,0x2a,1), bURL._508_4_ == 0)))) {
        bURL._508_4_ = curl_easy_perform(lVar2);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_1_ = bURL[0x1fc];
      URL_local._5_1_ = bURL[0x1fd];
      URL_local._6_1_ = bURL[0x1fe];
      URL_local._7_1_ = bURL[0x1ff];
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_FAILED_INIT;
  char bURL[512];
  msnprintf(bURL, sizeof(bURL),
            "%s HTTP/1.1\r\nGET http://1529.com/1529", URL);

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, bURL);
  test_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
  test_setopt(curl, CURLOPT_HEADER, 1L);

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}